

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O2

word Sbd_ManSolverSupp(Vec_Int_t *vSop,int *pInds,int *pnVars)

{
  int Lit;
  uint uVar1;
  int iVar2;
  int i;
  ulong uVar3;
  
  i = 0;
  uVar3 = 0;
  iVar2 = 0;
  do {
    if (vSop->nSize <= i) {
      *pnVars = iVar2;
      return uVar3;
    }
    Lit = Vec_IntEntry(vSop,i);
    if (Lit != -1) {
      uVar1 = Abc_Lit2Var(Lit);
      if (0x3f < uVar1) {
        __assert_fail("Abc_Lit2Var(Entry) < 64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                      ,0x14f,"word Sbd_ManSolverSupp(Vec_Int_t *, int *, int *)");
      }
      uVar1 = Abc_Lit2Var(Lit);
      if ((uVar3 >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
        uVar1 = Abc_Lit2Var(Lit);
        pInds[uVar1] = iVar2;
        uVar1 = Abc_Lit2Var(Lit);
        uVar3 = uVar3 | 1L << ((ulong)uVar1 & 0x3f);
        iVar2 = iVar2 + 1;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

word Sbd_ManSolverSupp( Vec_Int_t * vSop, int * pInds, int * pnVars )
{
    word Supp = 0;
    int i, Entry, nVars = 0;
    Vec_IntForEachEntry( vSop, Entry, i )
    {
        if ( Entry == -1 )
            continue;
        assert( Abc_Lit2Var(Entry) < 64 );
        if ( (Supp >> Abc_Lit2Var(Entry)) & 1 )
            continue;
        pInds[Abc_Lit2Var(Entry)] = nVars++;
        Supp |= (word)1 << Abc_Lit2Var(Entry);
    }
    *pnVars = nVars;
    return Supp;
}